

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDisabledOverrideReenable(void)

{
  int *__src;
  ImGuiContext *pIVar1;
  int iVar2;
  int *__dest;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  pIVar1 = GImGui;
  (GImGui->Style).Alpha = GImGui->DisabledAlphaBackup;
  uVar3 = pIVar1->CurrentItemFlags & 0xfffffbff;
  pIVar1->CurrentItemFlags = uVar3;
  iVar2 = (pIVar1->ItemFlagsStack).Size;
  if (iVar2 == (pIVar1->ItemFlagsStack).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    __dest = (int *)MemAlloc((long)iVar5 << 2);
    __src = (pIVar1->ItemFlagsStack).Data;
    if (__src != (int *)0x0) {
      memcpy(__dest,__src,(long)(pIVar1->ItemFlagsStack).Size << 2);
      MemFree((pIVar1->ItemFlagsStack).Data);
    }
    (pIVar1->ItemFlagsStack).Data = __dest;
    (pIVar1->ItemFlagsStack).Capacity = iVar5;
    uVar3 = pIVar1->CurrentItemFlags;
    iVar2 = (pIVar1->ItemFlagsStack).Size;
  }
  else {
    __dest = (pIVar1->ItemFlagsStack).Data;
  }
  __dest[iVar2] = uVar3;
  (pIVar1->ItemFlagsStack).Size = (pIVar1->ItemFlagsStack).Size + 1;
  pIVar1->DisabledStackSize = pIVar1->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentItemFlags & ImGuiItemFlags_Disabled);
    g.Style.Alpha = g.DisabledAlphaBackup;
    g.CurrentItemFlags &= ~ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}